

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateSetFlagOption(HelicsFederate fed,int flag,HelicsBool flagValue,HelicsError *err)

{
  Federate *pFVar1;
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 != (Federate *)0x0) {
    (*pFVar1->_vptr_Federate[5])(pFVar1,flag,(ulong)(flagValue != 0));
  }
  return;
}

Assistant:

void helicsFederateSetFlagOption(HelicsFederate fed, int flag, HelicsBool flagValue, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->setFlagOption(flag, (flagValue != HELICS_FALSE));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}